

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo5.cpp
# Opt level: O3

int64_t primecount::pi_lmo5(int64_t x,bool is_print)

{
  uint *puVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 res_00 [16];
  uchar *puVar7;
  bool bVar8;
  uint64_t uVar9;
  long lVar10;
  uint64_t uVar11;
  ulong uVar12;
  uint64_t uVar13;
  int *piVar14;
  int *piVar15;
  uint *puVar16;
  byte bVar17;
  long res;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  long *plVar21;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  long *plVar22;
  ulong uVar23;
  uint64_t prime;
  long lVar24;
  uint64_t uVar25;
  ulong uVar26;
  int *prime_00;
  ulong uVar27;
  int64_t m;
  int64_t iVar28;
  ulong uVar29;
  string_view_t str;
  string_view_t str_00;
  string_view_t str_01;
  string_view_t str_02;
  string_view_t str_03;
  string_view_t str_04;
  string_view_t str_05;
  type primes;
  Vector<int,_std::allocator<int>_> pi;
  Vector<int,_std::allocator<int>_> mu;
  Vector<int,_std::allocator<int>_> lpf;
  undefined1 in_stack_fffffffffffffdc8 [15];
  byte in_stack_fffffffffffffdd7;
  long local_228;
  Vector<int,_std::allocator<int>_> local_1e8;
  ulong local_1d0;
  uint *local_1c8;
  uint64_t local_1c0;
  long local_1b8;
  uint64_t local_1b0;
  long *local_1a8;
  int *local_1a0;
  Vector<long,_std::allocator<long>_> local_198;
  uint64_t local_178;
  long local_170;
  long local_168;
  ulong local_160;
  uint64_t local_158;
  uint64_t local_150;
  int64_t local_148;
  uint64_t local_140;
  Sieve local_138;
  Vector<int,_std::allocator<int>_> local_a8;
  double local_90;
  int64_t local_88;
  ulong local_80;
  uint64_t local_78;
  long local_70;
  long local_68;
  Vector<int,_std::allocator<int>_> local_60;
  Vector<int,_std::allocator<int>_> local_48;
  char *extraout_RDX;
  
  if (x < 2) {
    iVar28 = 0;
  }
  else {
    x_00[0xf] = in_stack_fffffffffffffdd7;
    x_00._0_15_ = in_stack_fffffffffffffdc8;
    dVar5 = get_alpha_lmo((primecount *)x,(maxint_t)x_00);
    dVar6 = cbrt((double)x);
    uVar18 = (ulong)dVar6;
    if (0 < (long)uVar18) {
      do {
        if (uVar18 * uVar18 - (ulong)x / uVar18 == 0 ||
            (long)(uVar18 * uVar18) < (long)((ulong)x / uVar18)) goto LAB_0011ae93;
        bVar8 = 1 < (long)uVar18;
        uVar18 = uVar18 - 1;
      } while (bVar8);
      uVar18 = 0;
    }
LAB_0011ae93:
    lVar19 = uVar18 - 1;
    do {
      lVar10 = lVar19 + 2;
      lVar19 = lVar19 + 1;
    } while (lVar10 * lVar10 - x / lVar10 == 0 || lVar10 * lVar10 < x / lVar10);
    uVar18 = (ulong)(dVar5 * (double)lVar19);
    local_1d0 = 8;
    if (uVar18 < 0x14) {
      local_1d0 = (ulong)(byte)(&PhiTiny::pi)[uVar18];
    }
    if (is_print) {
      str._M_str = (char *)(x % (long)uVar18);
      str._M_len = (size_t)"";
      print((primecount *)0x0,str);
      str_00._M_str = extraout_RDX;
      str_00._M_len = (size_t)"=== pi_lmo5(x) ===";
      print((primecount *)0x12,str_00);
      str_01._M_str = extraout_RDX_00;
      str_01._M_len = (size_t)"pi(x) = S1 + S2 + pi(y) - 1 - P2";
      print((primecount *)0x20,str_01);
      x_01[0xf] = in_stack_fffffffffffffdd7;
      x_01._0_15_ = in_stack_fffffffffffffdc8;
      print((primecount *)x,(maxint_t)x_01,0,uVar18,x / (long)uVar18,(int)local_1d0);
    }
    generate_primes_i32(&local_1e8,uVar18);
    generate_lpf(&local_48,uVar18);
    generate_moebius(&local_60,uVar18);
    lVar19 = (long)local_1e8.end_ - (long)local_1e8.array_;
    bVar8 = primecount::is_print();
    lVar19 = (lVar19 >> 2) + -1;
    local_80 = P2(x,uVar18,lVar19,1,bVar8);
    local_88 = S1(x,uVar18,local_1d0,1,is_print);
    if (is_print) {
      str_02._M_str = extraout_RDX_01;
      str_02._M_len = (size_t)"";
      print((primecount *)0x0,str_02);
      str_03._M_str = extraout_RDX_02;
      str_03._M_len = (size_t)"=== S2(x, y) ===";
      print((primecount *)0x10,str_03);
      str_04._M_str = extraout_RDX_03;
      str_04._M_len = (size_t)"Algorithm: POPCNT64 bit counting";
      print((primecount *)0x20,str_04);
      local_90 = get_time();
    }
    uVar9 = x / (long)uVar18;
    dVar5 = (double)(long)uVar9;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    uVar25 = 0xb504f333;
    if ((long)dVar5 < 0xb504f333) {
      uVar25 = (long)dVar5;
    }
    if ((long)uVar9 < (long)(uVar25 * uVar25)) {
      do {
        uVar25 = uVar25 - 1;
      } while (uVar25 * uVar25 - uVar9 != 0 && (long)uVar9 <= (long)(uVar25 * uVar25));
    }
    else {
      lVar10 = uVar25 * 2;
      if (lVar10 < (long)(uVar9 - uVar25 * uVar25)) {
        do {
          uVar25 = uVar25 + 1;
          lVar10 = lVar10 + 2;
        } while (lVar10 < (long)(uVar9 - uVar25 * uVar25));
      }
    }
    uVar25 = Sieve::align_segment_size(uVar25);
    Sieve::Sieve(&local_138,0,uVar25,(long)local_1e8.end_ - (long)local_1e8.array_ >> 2);
    local_178 = uVar25;
    generate_pi(&local_a8,uVar18);
    local_198.array_ = (long *)0x0;
    local_198.end_ = (long *)0x0;
    local_198.capacity_ = (long *)0x0;
    Vector<long,_std::allocator<long>_>::resize
              (&local_198,(long)local_1e8.end_ - (long)local_1e8.array_ >> 2);
    if (local_198.array_ != local_198.end_) {
      memset(local_198.array_,0,(long)local_198.end_ - (long)local_198.array_ & 0xfffffffffffffff8);
    }
    dVar5 = (double)(long)uVar18;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    lVar10 = 0xb504f333;
    if ((long)dVar5 < 0xb504f333) {
      lVar10 = (long)dVar5;
    }
    if ((long)uVar18 < lVar10 * lVar10) {
      do {
        lVar10 = lVar10 + -1;
      } while (lVar10 * lVar10 - uVar18 != 0 && (long)uVar18 <= lVar10 * lVar10);
    }
    else {
      lVar24 = lVar10 * 2;
      if (lVar24 < (long)(uVar18 - lVar10 * lVar10)) {
        do {
          lVar10 = lVar10 + 1;
          lVar24 = lVar24 + 2;
        } while (lVar24 < (long)(uVar18 - lVar10 * lVar10));
      }
    }
    if ((long)uVar9 < 1) {
      local_228 = 0;
    }
    else {
      local_70 = (long)local_a8.array_[lVar10];
      local_170 = (long)local_a8.array_[uVar18];
      local_1b8 = 0;
      local_78 = 0;
      local_228 = 0;
      local_168 = lVar19;
      local_160 = uVar18;
      local_148 = x;
      do {
        uVar12 = local_1d0;
        uVar25 = local_78 + local_178;
        local_150 = uVar25;
        if ((long)uVar9 < (long)uVar25) {
          local_150 = uVar9;
        }
        local_158 = 1;
        if (1 < (long)local_78) {
          local_158 = local_78;
        }
        local_140 = local_78;
        uVar13 = local_78;
        local_78 = uVar25;
        Sieve::pre_sieve<int>(&local_138,&local_1e8,local_1d0,uVar13,local_150);
        while (puVar7 = local_138.sieve_.array_, plVar22 = local_198.array_, uVar25 = uVar12 + 1,
              (long)uVar12 < local_70) {
          iVar3 = local_1e8.array_[uVar25];
          prime = (uint64_t)iVar3;
          uVar11 = x / (long)(local_150 * prime);
          uVar13 = (long)uVar18 / (long)prime;
          if ((long)uVar18 / (long)prime < (long)uVar11) {
            uVar13 = uVar11;
          }
          uVar12 = x / (long)(local_158 * prime);
          if ((long)uVar18 <= (long)uVar12) {
            uVar12 = uVar18;
          }
          if ((long)uVar12 <= (long)prime) goto LAB_0011b975;
          if ((long)uVar13 < (long)uVar12) {
            local_1c8 = local_138.counter_.counter.array_;
            local_1c0 = local_138.counter_.dist;
            local_68 = -local_138.counter_.dist;
            local_1a0 = local_60.array_;
            local_1a8 = (long *)local_48.array_;
            piVar14 = local_60.array_;
            plVar21 = (long *)local_48.array_;
            in_stack_fffffffffffffdd7 = (anonymous_namespace)::cpu_supports_popcnt;
            local_1b0 = uVar13;
            do {
              iVar4 = piVar14[uVar12];
              if (((long)iVar4 != 0) && (iVar3 < *(int *)((long)plVar21 + uVar12 * 4))) {
                lVar19 = x / (long)(uVar12 * prime);
                uVar20 = lVar19 - local_140;
                uVar18 = local_138.prev_stop_ + 1;
                local_138.prev_stop_ = uVar20;
                if (uVar18 <= uVar20) {
                  if (local_138.counter_.stop <= uVar20) {
                    do {
                      local_138.counter_.stop = local_138.counter_.stop + local_1c0;
                      puVar1 = local_1c8 + local_138.counter_.i;
                      local_138.counter_.i = local_138.counter_.i + 1;
                      local_138.counter_.sum = local_138.counter_.sum + *puVar1;
                    } while (local_138.counter_.stop <= uVar20);
                    uVar18 = local_138.counter_.stop + local_68;
                    local_138.count_ = local_138.counter_.sum;
                  }
                  uVar23 = uVar18 / 0xf0;
                  uVar29 = uVar20 / 0xf0;
                  uVar27 = 0xffffffffffffffff;
                  if (uVar23 == uVar29) {
                    uVar27 = *(ulong *)(Sieve::unset_larger +
                                       (ulong)(uint)((int)uVar20 + (int)uVar29 * -0xf0) * 8);
                  }
                  uVar26 = 0;
                  if (uVar23 != uVar29) {
                    uVar26 = *(ulong *)(Sieve::unset_larger +
                                       (ulong)(uint)((int)uVar20 + (int)uVar29 * -0xf0) * 8);
                  }
                  uVar20 = uVar27 & *(ulong *)(Sieve::unset_smaller +
                                              (ulong)(uint)((int)uVar18 + (int)uVar23 * -0xf0) * 8)
                           & *(ulong *)(puVar7 + uVar23 * 8);
                  uVar18 = *(ulong *)(puVar7 + uVar29 * 8);
                  if ((in_stack_fffffffffffffdd7 & 1) == 0) {
                    uVar11 = anon_unknown.dwarf_92382::popcnt64_bitwise_noinline(uVar20);
                    uVar13 = anon_unknown.dwarf_92382::popcnt64_bitwise_noinline(uVar26 & uVar18);
                    bVar17 = in_stack_fffffffffffffdd7;
                  }
                  else {
                    uVar11 = POPCOUNT(uVar20);
                    uVar13 = POPCOUNT(uVar26 & uVar18);
                    bVar17 = in_stack_fffffffffffffdd7;
                  }
                  lVar10 = uVar11 + uVar13;
                  uVar23 = uVar23 + 1;
                  in_stack_fffffffffffffdd7 = bVar17;
                  if (uVar23 < uVar29) {
                    uVar18 = lVar19 + local_1b8;
                    do {
                      if ((bVar17 & 1) == 0) {
                        bVar17 = in_stack_fffffffffffffdd7;
                        uVar13 = anon_unknown.dwarf_92382::popcnt64_bitwise_noinline
                                           (*(uint64_t *)(puVar7 + uVar23 * 8));
                        in_stack_fffffffffffffdd7 = bVar17;
                      }
                      else {
                        uVar13 = POPCOUNT(*(uint64_t *)(puVar7 + uVar23 * 8));
                      }
                      lVar10 = lVar10 + uVar13;
                      uVar23 = uVar23 + 1;
                    } while (uVar18 / 0xf0 != uVar23);
                  }
                  local_138.count_ = lVar10 + local_138.count_;
                  uVar13 = local_1b0;
                  x = local_148;
                }
                local_228 = local_228 - (local_138.count_ + plVar22[uVar25]) * (long)iVar4;
                piVar14 = local_1a0;
                plVar21 = local_1a8;
              }
              uVar12 = uVar12 - 1;
            } while ((long)uVar13 < (long)uVar12);
          }
          plVar22 = plVar22 + uVar25;
          *plVar22 = *plVar22 + local_138.total_count_;
          Sieve::cross_off_count(&local_138,prime,uVar25);
          uVar12 = uVar25;
          lVar19 = local_168;
          uVar18 = local_160;
        }
        if ((long)uVar25 < local_170) {
          do {
            puVar1 = local_138.counter_.counter.array_;
            puVar7 = local_138.sieve_.array_;
            piVar14 = local_1e8.array_;
            prime_00 = (int *)(long)local_1e8.array_[uVar25];
            uVar12 = x / (long)(local_158 * (long)prime_00);
            if ((long)uVar18 <= (long)uVar12) {
              uVar12 = uVar18;
            }
            lVar10 = (long)local_a8.array_[uVar12];
            piVar15 = (int *)(x / (long)(local_150 * (long)prime_00));
            local_1a0 = prime_00;
            if ((long)prime_00 < (long)piVar15) {
              local_1a0 = piVar15;
            }
            lVar24 = (long)local_1e8.array_[lVar10];
            if (local_1e8.array_[lVar10] <= local_1e8.array_[uVar25]) break;
            if ((long)piVar15 < lVar24) {
              local_1b0 = local_138.counter_.dist;
              local_1c0 = -local_138.counter_.dist;
              local_1a8 = local_198.array_;
              uVar13 = local_138.prev_stop_;
              in_stack_fffffffffffffdd7 = (anonymous_namespace)::cpu_supports_popcnt;
              do {
                puVar16 = (uint *)(x / (lVar24 * (long)prime_00));
                uVar12 = (long)puVar16 - local_140;
                uVar18 = uVar13 + 1;
                local_138.prev_stop_ = uVar12;
                if (uVar18 <= uVar12) {
                  if (local_138.counter_.stop <= uVar12) {
                    do {
                      local_138.counter_.stop = local_138.counter_.stop + local_1b0;
                      puVar2 = puVar1 + local_138.counter_.i;
                      local_138.counter_.i = local_138.counter_.i + 1;
                      local_138.counter_.sum = local_138.counter_.sum + *puVar2;
                    } while (local_138.counter_.stop <= uVar12);
                    uVar18 = local_138.counter_.stop + local_1c0;
                    local_138.count_ = local_138.counter_.sum;
                  }
                  uVar27 = uVar18 / 0xf0;
                  uVar23 = uVar12 / 0xf0;
                  uVar20 = 0xffffffffffffffff;
                  if (uVar27 == uVar23) {
                    uVar20 = *(ulong *)(Sieve::unset_larger +
                                       (ulong)(uint)((int)uVar12 + (int)uVar23 * -0xf0) * 8);
                  }
                  uVar29 = 0;
                  if (uVar27 != uVar23) {
                    uVar29 = *(ulong *)(Sieve::unset_larger +
                                       (ulong)(uint)((int)uVar12 + (int)uVar23 * -0xf0) * 8);
                  }
                  uVar20 = uVar20 & *(ulong *)(Sieve::unset_smaller +
                                              (ulong)(uint)((int)uVar18 + (int)uVar27 * -0xf0) * 8)
                           & *(ulong *)(puVar7 + uVar27 * 8);
                  uVar18 = *(ulong *)(puVar7 + uVar23 * 8);
                  if ((in_stack_fffffffffffffdd7 & 1) == 0) {
                    local_1c8 = puVar16;
                    uVar11 = anon_unknown.dwarf_92382::popcnt64_bitwise_noinline(uVar20);
                    uVar13 = anon_unknown.dwarf_92382::popcnt64_bitwise_noinline(uVar29 & uVar18);
                    puVar16 = local_1c8;
                    bVar17 = in_stack_fffffffffffffdd7;
                  }
                  else {
                    uVar11 = POPCOUNT(uVar20);
                    uVar13 = POPCOUNT(uVar29 & uVar18);
                    bVar17 = in_stack_fffffffffffffdd7;
                  }
                  lVar19 = uVar11 + uVar13;
                  uVar27 = uVar27 + 1;
                  in_stack_fffffffffffffdd7 = bVar17;
                  if (uVar27 < uVar23) {
                    uVar18 = (long)puVar16 + local_1b8;
                    do {
                      if ((bVar17 & 1) == 0) {
                        bVar17 = in_stack_fffffffffffffdd7;
                        uVar13 = anon_unknown.dwarf_92382::popcnt64_bitwise_noinline
                                           (*(uint64_t *)(puVar7 + uVar27 * 8));
                        in_stack_fffffffffffffdd7 = bVar17;
                      }
                      else {
                        uVar13 = POPCOUNT(*(uint64_t *)(puVar7 + uVar27 * 8));
                      }
                      lVar19 = lVar19 + uVar13;
                      uVar27 = uVar27 + 1;
                    } while (uVar18 / 0xf0 != uVar27);
                  }
                  local_138.count_ = lVar19 + local_138.count_;
                  x = local_148;
                }
                lVar19 = local_1a8[uVar25];
                local_228 = local_228 + local_138.count_ + lVar19;
                lVar24 = (long)piVar14[lVar10 + -1];
                lVar10 = lVar10 + -1;
                plVar22 = local_1a8;
                uVar13 = uVar12;
              } while ((long)local_1a0 < lVar24);
            }
            else {
              lVar19 = local_198.array_[uVar25];
              plVar22 = local_198.array_;
            }
            plVar22[uVar25] = lVar19 + local_138.total_count_;
            Sieve::cross_off_count(&local_138,(uint64_t)prime_00,uVar25);
            uVar25 = uVar25 + 1;
            lVar19 = local_168;
            uVar18 = local_160;
          } while ((long)uVar25 < local_170);
        }
LAB_0011b975:
        local_1b8 = local_1b8 - local_178;
      } while ((long)local_78 < (long)uVar9);
    }
    if (is_print) {
      res_00[0xf] = in_stack_fffffffffffffdd7;
      res_00._0_15_ = in_stack_fffffffffffffdc8;
      str_05._M_str = "S2";
      str_05._M_len = 2;
      print(str_05,(maxint_t)res_00,local_90);
    }
    operator_delete(local_198.array_,(long)local_198.capacity_ - (long)local_198.array_);
    operator_delete(local_a8.array_,(long)local_a8.capacity_ - (long)local_a8.array_);
    operator_delete(local_138.counter_.counter.array_,
                    (long)local_138.counter_.counter.capacity_ -
                    (long)local_138.counter_.counter.array_);
    operator_delete(local_138.wheel_.array_,
                    (long)local_138.wheel_.capacity_ - (long)local_138.wheel_.array_);
    operator_delete(local_138.sieve_.array_,
                    (long)local_138.sieve_.capacity_ - (long)local_138.sieve_.array_);
    iVar28 = local_88 + local_228 + lVar19 + ~local_80;
    operator_delete(local_60.array_,(long)local_60.capacity_ - (long)local_60.array_);
    operator_delete(local_48.array_,(long)local_48.capacity_ - (long)local_48.array_);
    operator_delete(local_1e8.array_,(long)local_1e8.capacity_ - (long)local_1e8.array_);
  }
  return iVar28;
}

Assistant:

int64_t pi_lmo5(int64_t x, bool is_print)
{
  if (x < 2)
    return 0;

  int threads = 1;
  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t z = x / y;
  int64_t c = PhiTiny::get_c(y);

  if (is_print)
  {
    print("");
    print("=== pi_lmo5(x) ===");
    print("pi(x) = S1 + S2 + pi(y) - 1 - P2");
    print(x, y, z, c, threads);
  }

  auto primes = generate_primes<int32_t>(y);
  auto lpf = generate_lpf(y);
  auto mu = generate_moebius(y);

  int64_t pi_y = primes.size() - 1;
  int64_t p2 = P2(x, y, pi_y, threads);
  int64_t s1 = S1(x, y, c, threads, is_print);
  int64_t s2 = S2(x, y, c, primes, lpf, mu, is_print);
  int64_t phi = s1 + s2;
  int64_t sum = phi + pi_y - 1 - p2;

  return sum;
}